

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O1

bool compare_defaults(t_const_value *newStructDefault,t_const_value *oldStructDefault)

{
  pointer pptVar1;
  pointer pcVar2;
  bool bVar3;
  t_const_value_type tVar4;
  t_const_value_type tVar5;
  int iVar6;
  int64_t iVar7;
  int64_t iVar8;
  pointer pptVar9;
  pointer pptVar10;
  bool bVar11;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  newMap;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  oldMap;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_80;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_50;
  
  if (newStructDefault == (t_const_value *)0x0 && oldStructDefault == (t_const_value *)0x0) {
    return true;
  }
  if ((newStructDefault == (t_const_value *)0x0) != (oldStructDefault == (t_const_value *)0x0))
  goto switchD_00137079_default;
  tVar4 = t_const_value::get_type(newStructDefault);
  tVar5 = t_const_value::get_type(oldStructDefault);
  if (tVar4 != tVar5) goto switchD_00137079_default;
  tVar4 = t_const_value::get_type(newStructDefault);
  switch(tVar4) {
  case CV_INTEGER:
    iVar7 = t_const_value::get_integer(newStructDefault);
    iVar8 = t_const_value::get_integer(oldStructDefault);
    bVar11 = iVar7 == iVar8;
    break;
  case CV_DOUBLE:
    bVar11 = (bool)(-(oldStructDefault->doubleVal_ == newStructDefault->doubleVal_) & 1);
    break;
  case CV_STRING:
    local_80._M_impl._0_8_ = &local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = (newStructDefault->stringVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + (newStructDefault->stringVal_)._M_string_length);
    local_50._M_impl._0_8_ = &local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = (oldStructDefault->stringVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (oldStructDefault->stringVal_)._M_string_length);
    goto LAB_001371f0;
  case CV_MAP:
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_80,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)newStructDefault);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_50,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)oldStructDefault);
    if (local_50._M_impl.super__Rb_tree_header._M_node_count ==
        local_80._M_impl.super__Rb_tree_header._M_node_count) {
      bVar11 = std::
               equal<std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,bool(*)(std::pair<t_const_value*,t_const_value*>,std::pair<t_const_value*,t_const_value*>)>
                         ((_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                           )local_80._M_impl.super__Rb_tree_header._M_header._M_left,
                          (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                           )&local_80._M_impl.super__Rb_tree_header,
                          (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                           )local_50._M_impl.super__Rb_tree_header._M_header._M_left,compare_pair);
    }
    else {
      bVar11 = false;
    }
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_50);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_80);
    break;
  case CV_LIST:
    pptVar9 = (oldStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar10 = (newStructDefault->listVal_).
               super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pptVar1 = (newStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)(oldStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pptVar9 == (long)pptVar1 - (long)pptVar10) {
      bVar11 = pptVar10 == pptVar1;
      if (bVar11) {
        return bVar11;
      }
      bVar3 = compare_defaults(*pptVar10,*pptVar9);
      if (!bVar3) {
        return bVar11;
      }
      do {
        pptVar10 = pptVar10 + 1;
        pptVar9 = pptVar9 + 1;
        bVar11 = pptVar10 == pptVar1;
        if (bVar11) {
          return bVar11;
        }
        bVar3 = compare_defaults(*pptVar10,*pptVar9);
      } while (bVar3);
      return bVar11;
    }
  default:
switchD_00137079_default:
    bVar11 = false;
    break;
  case CV_IDENTIFIER:
    local_80._M_impl._0_8_ = &local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = (newStructDefault->identifierVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,
               pcVar2 + (newStructDefault->identifierVal_)._M_string_length);
    local_50._M_impl._0_8_ = &local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = (oldStructDefault->identifierVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,
               pcVar2 + (oldStructDefault->identifierVal_)._M_string_length);
LAB_001371f0:
    if (local_80._M_impl.super__Rb_tree_header._M_header._0_8_ ==
        local_50._M_impl.super__Rb_tree_header._M_header._0_8_) {
      if (local_80._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
        bVar11 = true;
      }
      else {
        iVar6 = bcmp((void *)local_80._M_impl._0_8_,(void *)local_50._M_impl._0_8_,
                     local_80._M_impl.super__Rb_tree_header._M_header._0_8_);
        bVar11 = iVar6 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if ((_Base_ptr *)local_50._M_impl._0_8_ !=
        &local_50._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_50._M_impl._0_8_);
    }
    if ((_Base_ptr *)local_80._M_impl._0_8_ !=
        &local_80._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_80._M_impl._0_8_);
    }
  }
  return bVar11;
}

Assistant:

bool compare_defaults(t_const_value* newStructDefault, t_const_value* oldStructDefault)
{
   if(newStructDefault == nullptr && oldStructDefault == nullptr) return true;
   else if(newStructDefault == nullptr && oldStructDefault != nullptr) return false;
   else if (newStructDefault != nullptr && oldStructDefault == nullptr) return false;

   if(newStructDefault->get_type() != oldStructDefault->get_type())
   {
      return false;
   }

   switch(newStructDefault->get_type())
   {
      case t_const_value::CV_INTEGER:
         return (newStructDefault->get_integer() == oldStructDefault->get_integer());
      case t_const_value::CV_DOUBLE:
         return (newStructDefault->get_double() == oldStructDefault->get_double());
      case t_const_value::CV_STRING:
         return (newStructDefault->get_string() == oldStructDefault->get_string());
      case t_const_value::CV_LIST:
         {
            const std::vector<t_const_value*>& oldDefaultList = oldStructDefault->get_list();
            const std::vector<t_const_value*>& newDefaultList = newStructDefault->get_list();
            bool defaultValuesCompare = (oldDefaultList.size() == newDefaultList.size());

            return defaultValuesCompare && std::equal(newDefaultList.begin(), newDefaultList.end(), oldDefaultList.begin(), compare_defaults);
         }
      case t_const_value::CV_MAP:
         {
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> newMap = newStructDefault->get_map();
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> oldMap = oldStructDefault->get_map();

            bool defaultValuesCompare = (oldMap.size() == newMap.size());

            return defaultValuesCompare && std::equal(newMap.begin(), newMap.end(), oldMap.begin(), compare_pair);
         }
      case t_const_value::CV_IDENTIFIER:
         return (newStructDefault->get_identifier() == oldStructDefault->get_identifier());
      default:
         return false;
   }

}